

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem.cc
# Opt level: O3

void __thiscall mp::LinearExpr::SortTerms(LinearExpr *this)

{
  return;
}

Assistant:

void LinearExpr::SortTerms() {
  assert(0);
  /*
  std::map<int, double> var_coef_map;      // slow @todo
  for (int i=0; i<num_terms(); ++i)
    if (0.0!=std::fabs(coef(i)))
      var_coef_map[var_index(i)] += coef(i);
  terms_.clear();
  for (const auto& vc: var_coef_map) {
    if (0.0!=std::fabs(vc.second))
      AddTerm(vc.first, vc.second);
  } */
}